

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O2

ggml_backend_buffer *
ggml_backend_alloc_ctx_tensors_from_buft(ggml_context *ctx,ggml_backend_buffer_type_t buft)

{
  ulong uVar1;
  ggml_backend_buffer_t *__ptr;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  ggml_tensor *first;
  ggml_tensor *tensor;
  size_t sVar5;
  ggml_backend_buffer_t pgVar6;
  ulong uVar7;
  ggml_backend_buffer_t *buffers;
  size_t n_buffers;
  ggml_backend_buffer_t *local_58;
  ggml_backend_buffer_type_t local_50;
  size_t local_48;
  long local_40;
  ulong local_38;
  
  _Var2 = ggml_get_no_alloc(ctx);
  if (!_Var2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x3d9,"GGML_ASSERT(%s) failed","ggml_get_no_alloc(ctx) == true");
  }
  sVar3 = ggml_backend_buft_get_alignment(buft);
  local_50 = buft;
  sVar4 = ggml_backend_buft_get_max_size(buft);
  local_58 = (ggml_backend_buffer_t *)0x0;
  local_48 = 0;
  first = ggml_get_first_tensor(ctx);
  local_40 = sVar3 - 1;
  local_38 = -sVar3;
  sVar3 = 0;
  for (tensor = first; tensor != (ggml_tensor *)0x0; tensor = ggml_get_next_tensor(ctx,tensor)) {
    if ((tensor->data == (void *)0x0) && (tensor->view_src == (ggml_tensor *)0x0)) {
      sVar5 = ggml_backend_buft_get_alloc_size(local_50,tensor);
      uVar7 = sVar5 + local_40 & local_38;
    }
    else {
      uVar7 = 0;
    }
    uVar1 = uVar7 + sVar3;
    if (((sVar3 != 0) && (sVar4 < uVar1)) &&
       (_Var2 = alloc_tensor_range(ctx,first,tensor,local_50,sVar3,&local_58,&local_48),
       first = tensor, uVar1 = uVar7, !_Var2)) goto LAB_00129d22;
    sVar3 = uVar1;
  }
  if ((sVar3 != 0) &&
     (_Var2 = alloc_tensor_range(ctx,first,(ggml_tensor *)0x0,local_50,sVar3,&local_58,&local_48),
     !_Var2)) {
    return (ggml_backend_buffer *)0x0;
  }
  __ptr = local_58;
  if (local_48 == 0) {
LAB_00129d22:
    pgVar6 = (ggml_backend_buffer_t)0x0;
  }
  else {
    if (local_48 == 1) {
      pgVar6 = *local_58;
    }
    else {
      pgVar6 = ggml_backend_multi_buffer_alloc_buffer(local_58,local_48);
    }
    free(__ptr);
  }
  return pgVar6;
}

Assistant:

ggml_backend_buffer_t ggml_backend_alloc_ctx_tensors_from_buft(struct ggml_context * ctx, ggml_backend_buffer_type_t buft) {
    GGML_ASSERT(ggml_get_no_alloc(ctx) == true);

    size_t alignment = ggml_backend_buft_get_alignment(buft);
    size_t max_size = ggml_backend_buft_get_max_size(buft);

    ggml_backend_buffer_t * buffers = NULL;
    size_t n_buffers = 0;

    size_t cur_buf_size = 0;
    struct ggml_tensor * first = ggml_get_first_tensor(ctx);
    for (struct ggml_tensor * t = first; t != NULL; t = ggml_get_next_tensor(ctx, t)) {
        size_t this_size = 0;
        if (t->data == NULL && t->view_src == NULL) {
            this_size = GGML_PAD(ggml_backend_buft_get_alloc_size(buft, t), alignment);
        }

        if (cur_buf_size > 0 && (cur_buf_size + this_size) > max_size) {
            // allocate tensors in the current buffer
            if (!alloc_tensor_range(ctx, first, t, buft, cur_buf_size, &buffers, &n_buffers)) {
                return NULL;
            }
            first = t;
            cur_buf_size = this_size;
        } else {
            cur_buf_size += this_size;
        }
    }

    // allocate remaining tensors
    if (cur_buf_size > 0) {
        if (!alloc_tensor_range(ctx, first, NULL, buft, cur_buf_size, &buffers, &n_buffers)) {
            return NULL;
        }
    }

    if (n_buffers == 0) {
#ifndef NDEBUG
        GGML_LOG_DEBUG("%s: all tensors in the context are already allocated\n", __func__);
#endif
        return NULL;
    }

    ggml_backend_buffer_t buffer;
    if (n_buffers == 1) {
        buffer = buffers[0];
    } else {
        buffer = ggml_backend_multi_buffer_alloc_buffer(buffers, n_buffers);
    }
    free(buffers);
    return buffer;
}